

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp-mpiu.c
# Opt level: O1

void MPIU_Segmenter_init(MPIU_Segmenter *segmenter,size_t *sizes,size_t *sizes2,size_t avgsegsize,
                        int Ngroup,MPI_Comm comm)

{
  uint uVar1;
  int iVar2;
  int ThisTask;
  int NTask;
  int rank;
  int local_3c;
  int local_38;
  int local_34;
  
  MPI_Comm_size(comm,&local_38);
  MPI_Comm_rank(comm,&local_3c);
  uVar1 = _MPIU_Segmenter_assign_colors(avgsegsize,sizes,sizes2,&segmenter->Nsegments,comm);
  segmenter->ThisSegment = uVar1;
  if ((int)uVar1 < 0) {
    segmenter->GroupID = Ngroup + 1;
    segmenter->ThisSegment = local_38 + 1;
  }
  else {
    segmenter->GroupID = (int)(((long)Ngroup * (ulong)uVar1) / (ulong)(long)segmenter->Nsegments);
  }
  segmenter->Ngroup = Ngroup;
  MPI_Comm_split(comm,segmenter->GroupID,local_3c,&segmenter->Group);
  MPI_Allreduce(&segmenter->ThisSegment,&segmenter->segment_start,1,&ompi_mpi_int,&ompi_mpi_op_min,
                segmenter->Group);
  MPI_Allreduce(&segmenter->ThisSegment,&segmenter->segment_end,1,&ompi_mpi_int,&ompi_mpi_op_max,
                segmenter->Group);
  segmenter->segment_end = segmenter->segment_end + 1;
  MPI_Comm_rank(segmenter->Group,&local_34);
  iVar2 = MPIU_GetLoc(sizes + local_3c,(MPI_Datatype)&ompi_mpi_long,(MPI_Op)&ompi_mpi_op_max,
                      segmenter->Group);
  segmenter->group_leader_rank = iVar2;
  segmenter->is_group_leader = (uint)(local_34 == iVar2);
  MPI_Comm_split(comm,local_34 != iVar2,local_3c,&segmenter->Leaders);
  MPI_Comm_split(segmenter->Group,segmenter->ThisSegment,local_3c,&segmenter->Segment);
  iVar2 = MPIU_GetLoc(sizes + local_3c,(MPI_Datatype)&ompi_mpi_long,(MPI_Op)&ompi_mpi_op_min,
                      segmenter->Segment);
  segmenter->segment_leader_rank = iVar2;
  return;
}

Assistant:

void
MPIU_Segmenter_init(MPIU_Segmenter * segmenter,
               size_t * sizes,
               size_t * sizes2,
               size_t avgsegsize,
               int Ngroup,
               MPI_Comm comm)
{
    int ThisTask, NTask;

    MPI_Comm_size(comm, &NTask);
    MPI_Comm_rank(comm, &ThisTask);

    segmenter->ThisSegment = _MPIU_Segmenter_assign_colors(avgsegsize, sizes, sizes2, &segmenter->Nsegments, comm);

    if(segmenter->ThisSegment >= 0) {
        /* assign segments to groups.
         * if Nsegments < Ngroup, some groups will have no segments, and thus no ranks belong to them. */
        segmenter->GroupID = ((size_t) segmenter->ThisSegment) * Ngroup / segmenter->Nsegments;
    } else {
        segmenter->GroupID = Ngroup + 1;
        segmenter->ThisSegment = NTask + 1;
    }

    segmenter->Ngroup = Ngroup;

    MPI_Comm_split(comm, segmenter->GroupID, ThisTask, &segmenter->Group);

    MPI_Allreduce(&segmenter->ThisSegment, &segmenter->segment_start, 1, MPI_INT, MPI_MIN, segmenter->Group);
    MPI_Allreduce(&segmenter->ThisSegment, &segmenter->segment_end, 1, MPI_INT, MPI_MAX, segmenter->Group);

    segmenter->segment_end ++;

    int rank;

    MPI_Comm_rank(segmenter->Group, &rank);

    /* rank with most data in a group is the leader of the group. */
    segmenter->group_leader_rank = MPIU_GetLoc(&sizes[ThisTask], MPI_LONG, MPI_MAX, segmenter->Group);

    segmenter->is_group_leader = rank == segmenter->group_leader_rank;

    MPI_Comm_split(comm, (rank == segmenter->group_leader_rank)? 0 : 1, ThisTask, &segmenter->Leaders);

    MPI_Comm_split(segmenter->Group, segmenter->ThisSegment, ThisTask, &segmenter->Segment);

    /* rank with least data in a segment is the leader of the segment. */
    segmenter->segment_leader_rank = MPIU_GetLoc(&sizes[ThisTask], MPI_LONG, MPI_MIN, segmenter->Segment);
}